

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_info.cpp
# Opt level: O3

string * __thiscall
duckdb::TransactionInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,TransactionInfo *this)

{
  char cVar1;
  InternalException *pIVar2;
  string local_90;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,anon_var_dwarf_4ed193b + 9);
  if (2 < (byte)((this->super_ParseInfo).field_0x9 - 1)) {
    pIVar2 = (InternalException *)__cxa_allocate_exception(0x10);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"ToString for TransactionStatement with type: %s not implemented"
               ,"");
    EnumUtil::ToString<duckdb::TransactionType>(&local_50,(this->super_ParseInfo).field_0x9);
    InternalException::InternalException<std::__cxx11::string>(pIVar2,&local_90,&local_50);
    __cxa_throw(pIVar2,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  cVar1 = (this->super_ParseInfo).field_0xa;
  if (cVar1 != '\0') {
    if ((cVar1 != '\x01') && (cVar1 != '\x02')) {
      pIVar2 = (InternalException *)__cxa_allocate_exception(0x10);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,
                 "ToString for TransactionStatement with modifier type: %s not implemented","");
      EnumUtil::ToString<duckdb::TransactionModifierType>
                (&local_70,(this->super_ParseInfo).field_0xa);
      InternalException::InternalException<std::__cxx11::string>(pIVar2,&local_90,&local_70);
      __cxa_throw(pIVar2,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string TransactionInfo::ToString() const {
	string result = "";
	switch (type) {
	case TransactionType::BEGIN_TRANSACTION:
		result += "BEGIN";
		break;
	case TransactionType::COMMIT:
		result += "COMMIT";
		break;
	case TransactionType::ROLLBACK:
		result += "ROLLBACK";
		break;
	default: {
		throw InternalException("ToString for TransactionStatement with type: %s not implemented",
		                        EnumUtil::ToString(type));
	}
	}
	switch (modifier) {
	case TransactionModifierType::TRANSACTION_DEFAULT_MODIFIER:
		break;
	case TransactionModifierType::TRANSACTION_READ_ONLY:
		result += " READ ONLY";
		break;
	case TransactionModifierType::TRANSACTION_READ_WRITE:
		result += " READ WRITE";
		break;
	default:
		throw InternalException("ToString for TransactionStatement with modifier type: %s not implemented",
		                        EnumUtil::ToString(modifier));
	}
	result += ";";
	return result;
}